

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_bitwise.cpp
# Opt level: O2

spv_result_t
spvtools::val::ValidateBaseType(ValidationState_t *_,Instruction *inst,uint32_t base_type)

{
  ushort uVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  string sStack_228;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  bVar2 = ValidationState_t::IsIntScalarType(_,base_type);
  if ((bVar2) || (bVar2 = ValidationState_t::IsIntVectorType(_,base_type), bVar2)) {
    bVar2 = spvIsVulkanEnv(_->context_->target_env);
    if ((!bVar2) || (uVar3 = ValidationState_t::GetBitWidth(_,base_type), uVar3 == 0x20)) {
      if (uVar1 == OpBitCount) {
        return SPV_SUCCESS;
      }
      if ((inst->inst_).type_id == base_type) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_208,"Expected Base Type to be equal to Result Type: ");
      pcVar4 = spvOpcodeString((uint)uVar1);
      std::operator<<((ostream *)&local_208,pcVar4);
      goto LAB_0025b466;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&sStack_228,_,0x12ad,(char *)0x0);
    std::operator<<((ostream *)&local_208,(string *)&sStack_228);
    pcVar4 = "Expected 32-bit int type for Base operand: ";
  }
  else {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&sStack_228,_,0x12ad,(char *)0x0);
    std::operator<<((ostream *)&local_208,(string *)&sStack_228);
    pcVar4 = "Expected int scalar or vector type for Base operand: ";
  }
  std::operator<<((ostream *)&local_208,pcVar4);
  pcVar4 = spvOpcodeString((uint)uVar1);
  std::operator<<((ostream *)&local_208,pcVar4);
  std::__cxx11::string::_M_dispose();
LAB_0025b466:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t ValidateBaseType(ValidationState_t& _, const Instruction* inst,
                              const uint32_t base_type) {
  const spv::Op opcode = inst->opcode();

  if (!_.IsIntScalarType(base_type) && !_.IsIntVectorType(base_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << _.VkErrorID(4781)
           << "Expected int scalar or vector type for Base operand: "
           << spvOpcodeString(opcode);
  }

  // Vulkan has a restriction to 32 bit for base
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (_.GetBitWidth(base_type) != 32) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4781)
             << "Expected 32-bit int type for Base operand: "
             << spvOpcodeString(opcode);
    }
  }

  // OpBitCount just needs same number of components
  if (base_type != inst->type_id() && opcode != spv::Op::OpBitCount) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Base Type to be equal to Result Type: "
           << spvOpcodeString(opcode);
  }

  return SPV_SUCCESS;
}